

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Generators_Stratified3D_Test::TestBody(Generators_Stratified3D_Test *this)

{
  bool bVar1;
  float *pfVar2;
  float fVar3;
  undefined1 auVar5 [12];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  Point3f PVar7;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  int iz;
  int iy;
  int ix;
  Point3f u;
  Stratified3DIter __end1;
  Stratified3DIter __begin1;
  Stratified3D *__range1;
  int nz;
  int ny;
  int nx;
  int count;
  Stratified3DIter *in_stack_fffffffffffffdf8;
  AssertionResult *in_stack_fffffffffffffe00;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  AssertionResult *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe18;
  undefined2 in_stack_fffffffffffffe1c;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  Stratified3D *in_stack_fffffffffffffe20;
  Type in_stack_fffffffffffffe2c;
  AssertionResult *in_stack_fffffffffffffe30;
  Stratified3DIter *in_stack_fffffffffffffe40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  AssertionResult *in_stack_fffffffffffffe78;
  AssertHelper *in_stack_fffffffffffffe80;
  AssertionResult local_168;
  string local_158 [48];
  undefined1 local_128 [80];
  AssertionResult local_d8;
  int local_c4;
  int local_c0;
  int local_bc;
  Tuple3<pbrt::Point3,_float> local_b8;
  Tuple3<pbrt::Point3,_float> local_a4 [4];
  IndexingIterator<pbrt::detail::Stratified3DIter> local_70 [5];
  undefined1 local_48 [40];
  undefined1 *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  undefined1 auVar6 [56];
  
  local_c = 0;
  local_10 = 4;
  local_14 = 0x20;
  local_18 = 8;
  pbrt::Stratified3D::Stratified3D
            (in_stack_fffffffffffffe20,
             CONCAT13(in_stack_fffffffffffffe1f,
                      CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)),
             in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (uint64_t)in_stack_fffffffffffffe00);
  local_20 = local_48;
  pbrt::detail::IndexingGenerator<pbrt::Stratified3D,_pbrt::detail::Stratified3DIter>::begin
            ((IndexingGenerator<pbrt::Stratified3D,_pbrt::detail::Stratified3DIter> *)
             in_stack_fffffffffffffe00);
  pbrt::detail::IndexingGenerator<pbrt::Stratified3D,_pbrt::detail::Stratified3DIter>::end
            ((IndexingGenerator<pbrt::Stratified3D,_pbrt::detail::Stratified3DIter> *)
             in_stack_fffffffffffffe00);
  while( true ) {
    auVar6 = in_ZMM0._8_56_;
    bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Stratified3DIter>::operator!=
                      ((IndexingIterator<pbrt::detail::Stratified3DIter> *)in_stack_fffffffffffffe00
                       ,in_stack_fffffffffffffdf8);
    if (!bVar1) break;
    PVar7 = pbrt::detail::Stratified3DIter::operator*(in_stack_fffffffffffffe40);
    local_b8.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
    auVar4._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar4._8_56_ = auVar6;
    local_b8._0_8_ = vmovlpd_avx(auVar4._0_16_);
    local_bc = local_c % local_10;
    local_c0 = (int)((long)((ulong)(uint)((int)((long)local_c / (long)local_10) >> 0x1f) << 0x20 |
                           (long)local_c / (long)local_10 & 0xffffffffU) % (long)local_14);
    local_c4 = local_c / (local_10 * local_14);
    local_a4[0]._0_8_ = local_b8._0_8_;
    local_a4[0].z = local_b8.z;
    pfVar2 = pbrt::Tuple3<pbrt::Point3,_float>::operator[](local_a4,0);
    if ((float)local_bc / (float)local_10 <= *pfVar2) {
      pbrt::Tuple3<pbrt::Point3,_float>::operator[](local_a4,0);
    }
    in_stack_fffffffffffffe30 = &local_d8;
    testing::AssertionResult::AssertionResult
              (in_stack_fffffffffffffe00,SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffe30);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe30);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (char *)in_stack_fffffffffffffe60.ptr_);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                 (char *)in_stack_fffffffffffffe20,
                 CONCAT13(in_stack_fffffffffffffe1f,
                          CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)),
                 &in_stack_fffffffffffffe10->success_);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe80,(Message *)in_stack_fffffffffffffe78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe00);
      std::__cxx11::string::~string((string *)(local_128 + 0x10));
      testing::Message::~Message((Message *)0x647df0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x647e6b);
    pfVar2 = pbrt::Tuple3<pbrt::Point3,_float>::operator[](local_a4,1);
    in_stack_fffffffffffffe2c = in_stack_fffffffffffffe2c & 0xffffff;
    if ((float)local_c0 / (float)local_14 <= *pfVar2) {
      pfVar2 = pbrt::Tuple3<pbrt::Point3,_float>::operator[](local_a4,1);
      in_stack_fffffffffffffe2c =
           CONCAT13(*pfVar2 < (float)(local_c0 + 1) / (float)local_14,
                    (int3)in_stack_fffffffffffffe2c);
    }
    in_stack_fffffffffffffe20 = (Stratified3D *)local_128;
    testing::AssertionResult::AssertionResult
              (in_stack_fffffffffffffe00,SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe2c =
         CONCAT13((char)(in_stack_fffffffffffffe2c >> 0x18),
                  CONCAT12(bVar1,(short)in_stack_fffffffffffffe2c));
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe30);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (char *)in_stack_fffffffffffffe60.ptr_);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                 (char *)in_stack_fffffffffffffe20,
                 CONCAT13(in_stack_fffffffffffffe1f,
                          CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)),
                 &in_stack_fffffffffffffe10->success_);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe80,(Message *)in_stack_fffffffffffffe78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe00);
      std::__cxx11::string::~string(local_158);
      testing::Message::~Message((Message *)0x647fee);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x648069);
    pfVar2 = pbrt::Tuple3<pbrt::Point3,_float>::operator[](local_a4,2);
    in_ZMM0 = ZEXT464((uint)*pfVar2);
    auVar5 = (undefined1  [12])0x0;
    in_stack_fffffffffffffe1f = false;
    if ((float)local_c4 / (float)local_18 <= *pfVar2) {
      pfVar2 = pbrt::Tuple3<pbrt::Point3,_float>::operator[](local_a4,2);
      fVar3 = (float)(local_c4 + 1) / (float)local_18;
      in_ZMM0 = ZEXT1664(CONCAT124(auVar5,fVar3));
      in_stack_fffffffffffffe1f = *pfVar2 < fVar3;
    }
    in_stack_fffffffffffffe10 = &local_168;
    testing::AssertionResult::AssertionResult
              (in_stack_fffffffffffffe00,SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
    in_stack_fffffffffffffe1e =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffe10);
    if (!(bool)in_stack_fffffffffffffe1e) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe30);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (char *)in_stack_fffffffffffffe60.ptr_);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                 (char *)in_stack_fffffffffffffe20,
                 CONCAT13(in_stack_fffffffffffffe1f,
                          CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)),
                 &in_stack_fffffffffffffe10->success_);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe80,(Message *)in_stack_fffffffffffffe78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe00);
      in_ZMM0._0_8_ = std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
      in_ZMM0._8_56_ = extraout_var;
      testing::Message::~Message((Message *)0x6481e3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x648258);
    local_c = local_c + 1;
    pbrt::detail::IndexingIterator<pbrt::detail::Stratified3DIter>::operator++(local_70);
  }
  this_00 = (AssertionResult *)&stack0xfffffffffffffe58;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT17(in_stack_fffffffffffffe1f,
                              CONCAT16(in_stack_fffffffffffffe1e,
                                       CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)
                                      )),&in_stack_fffffffffffffe10->success_,
             (int *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe30);
    testing::AssertionResult::failure_message((AssertionResult *)0x648324);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
               (char *)in_stack_fffffffffffffe20,
               CONCAT13(in_stack_fffffffffffffe1f,
                        CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)),
               &in_stack_fffffffffffffe10->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe80,(Message *)in_stack_fffffffffffffe78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x648370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x6483bc);
  return;
}

Assistant:

TEST(Generators, Stratified3D) {
    int count = 0, nx = 4, ny = 32, nz = 8;  // power of 2
    for (Point3f u : Stratified3D(nx, ny, nz)) {
        int ix = count % nx;
        int iy = (count / nx) % ny;
        int iz = count / (nx * ny);
        EXPECT_TRUE(u[0] >= Float(ix) / Float(nx) && u[0] < Float(ix + 1) / Float(nx));
        EXPECT_TRUE(u[1] >= Float(iy) / Float(ny) && u[1] < Float(iy + 1) / Float(ny));
        EXPECT_TRUE(u[2] >= Float(iz) / Float(nz) && u[2] < Float(iz + 1) / Float(nz));
        ++count;
    }
    EXPECT_EQ(nx * ny * nz, count);
}